

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O0

void __thiscall bandit::reporter::info::it_succeeded(info *this,string *desc)

{
  reference pvVar1;
  ostream *poVar2;
  string local_88 [32];
  string local_68 [48];
  string local_38;
  string *local_18;
  string *desc_local;
  info *this_local;
  
  local_18 = desc;
  desc_local = (string *)this;
  progress_base::it_succeeded((progress_base *)this,desc);
  pvVar1 = std::
           stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
           ::top(&this->context_stack_);
  pvVar1->total = pvVar1->total + 1;
  this->indentation_ = this->indentation_ + -1;
  poVar2 = std::operator<<((this->super_colored_base).stm_,"\r");
  indent_abi_cxx11_(&local_38,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[2])(local_68);
  poVar2 = std::operator<<(poVar2,local_68);
  poVar2 = std::operator<<(poVar2,"[ PASS ]");
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(local_88);
  poVar2 = std::operator<<(poVar2,local_88);
  poVar2 = std::operator<<(poVar2," it ");
  poVar2 = std::operator<<(poVar2,(string *)local_18);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)&local_38);
  std::ostream::flush();
  return;
}

Assistant:

void it_succeeded(const std::string& desc) override {
        progress_base::it_succeeded(desc);
        ++context_stack_.top().total;
        --indentation_;
        stm_
            << "\r" << indent()
            << colorizer_.good()
            << "[ PASS ]"
            << colorizer_.reset()
            << " it " << desc
            << std::endl;
        stm_.flush();
      }